

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

string * __thiscall mocker::Lexer::getToken_abi_cxx11_(string *__return_storage_ptr__,Lexer *this)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  uint uVar6;
  char *pcVar7;
  size_t sVar8;
  byte *pbVar9;
  byte *pbVar10;
  
  pbVar2 = (byte *)(this->srcEnd)._M_current;
  sVar5 = (this->nxtPos).col;
  sVar8 = (this->nxtPos).line;
  pbVar10 = (byte *)(this->nxtBeg)._M_current;
LAB_0017c816:
  if (pbVar10 != pbVar2) goto code_r0x0017c81b;
  goto LAB_0017c86f;
code_r0x0017c81b:
  iVar3 = isspace((int)(char)*pbVar10);
  iVar4 = iVar3;
  while (iVar4 != 0) {
    pbVar9 = pbVar10 + 1;
    sVar5 = sVar5 + 1;
    (this->nxtPos).col = sVar5;
    if (*pbVar10 == 10) {
      sVar8 = sVar8 + 1;
      (this->nxtPos).line = sVar8;
      (this->nxtPos).col = 1;
      sVar5 = 1;
    }
    (this->nxtBeg)._M_current = (char *)pbVar9;
    pbVar10 = pbVar9;
    if (pbVar9 == pbVar2) goto LAB_0017c816;
    iVar4 = isspace((int)(char)*pbVar9);
  }
  if (iVar3 == 0) {
LAB_0017c86f:
    if ((((long)pbVar2 - (long)pbVar10 < 2) || (*pbVar10 != 0x2f)) || (pbVar10[1] != 0x2f))
    goto LAB_0017c8c2;
    while ((pbVar10 != pbVar2 && (*pbVar10 != 10))) {
      pbVar10 = pbVar10 + 1;
      (this->nxtBeg)._M_current = (char *)pbVar10;
    }
    if (*pbVar10 == 10) {
      pbVar10 = pbVar10 + 1;
      (this->nxtBeg)._M_current = (char *)pbVar10;
    }
    sVar8 = sVar8 + 1;
    (this->nxtPos).line = sVar8;
    (this->nxtPos).col = 1;
    sVar5 = 1;
  }
  goto LAB_0017c816;
LAB_0017c8c2:
  if ((byte *)(this->nxtBeg)._M_current == pbVar2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    pbVar10 = (byte *)(this->nxtBeg)._M_current;
    (this->curBeg)._M_current = (char *)pbVar10;
    sVar5 = (this->nxtPos).col;
    (this->curPos).line = (this->nxtPos).line;
    (this->curPos).col = sVar5;
    bVar1 = *pbVar10;
    iVar4 = ispunct((int)(char)bVar1);
    if (iVar4 == 0) {
      pbVar9 = (byte *)(this->nxtBeg)._M_current;
      if (pbVar9 != pbVar2) {
        sVar5 = (this->nxtPos).col;
        do {
          sVar5 = sVar5 + 1;
          bVar1 = *pbVar9;
          iVar4 = isalnum((int)(char)bVar1);
          if (((char)bVar1 != 0x5f) && (iVar4 == 0)) break;
          pbVar9 = pbVar9 + 1;
          (this->nxtBeg)._M_current = (char *)pbVar9;
          (this->nxtPos).col = sVar5;
        } while (pbVar9 != pbVar2);
      }
      pcVar7 = (this->curBeg)._M_current;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    }
    else {
      pbVar9 = pbVar10 + 1;
      (this->nxtBeg)._M_current = (char *)pbVar9;
      sVar5 = (this->nxtPos).col;
      (this->nxtPos).col = sVar5 + 1;
      if (pbVar9 == pbVar2) {
        pcVar7 = (this->curBeg)._M_current;
      }
      else {
        uVar6 = (uint)bVar1;
        if (((bVar1 == *pbVar9) &&
            (((uVar6 < 0x3f && ((0x7000284000000000U >> ((ulong)uVar6 & 0x3f) & 1) != 0)) ||
             (uVar6 == 0x7c)))) || (((bVar1 & 0xfd) == 0x3c || uVar6 == 0x21 && (*pbVar9 == 0x3d))))
        {
          (this->nxtBeg)._M_current = (char *)(pbVar10 + 2);
          (this->nxtPos).col = sVar5 + 2;
        }
        pcVar7 = (this->curBeg)._M_current;
        pbVar9 = (byte *)(this->nxtBeg)._M_current;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    }
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)__return_storage_ptr__,pcVar7,pbVar9);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Lexer::getToken() {
  // skip the whitespaces and comments
  auto skipWs = [this]() -> bool /* skipped something? */ {
    bool res = false;
    while (nxtBeg != srcEnd && std::isspace(*nxtBeg)) {
      res = true;
      ++nxtPos.col;
      if (*nxtBeg == '\n') {
        ++nxtPos.line;
        nxtPos.col = 1;
      }
      ++nxtBeg;
    }
    return res;
  };
  auto skipComment = [this]() -> bool {
    if (srcEnd - nxtBeg < 2 || *nxtBeg != '/' || *(nxtBeg + 1) != '/')
      return false;
    while (nxtBeg != srcEnd && *nxtBeg != '\n')
      ++nxtBeg;
    if (*nxtBeg == '\n')
      ++nxtBeg;
    ++nxtPos.line;
    nxtPos.col = 1;
    return true;
  };
  while (skipWs() || skipComment())
    ;

  if (nxtBeg == srcEnd)
    return "";

  curBeg = nxtBeg;
  curPos = nxtPos;
  if (std::ispunct(*nxtBeg)) {
    auto now = *nxtBeg;
    ++nxtBeg;
    ++nxtPos.col;
    if (nxtBeg == srcEnd)
      return {curBeg, nxtBeg};

    if (now == *nxtBeg &&
        (now == '-' || now == '+' || now == '=' || now == '<' || now == '>' ||
         now == '&' || now == '|')) {
      ++nxtBeg;
      ++nxtPos.col;
    } else if (*nxtBeg == '=' && (now == '<' || now == '>')) {
      ++nxtBeg;
      ++nxtPos.col;
    } else if (now == '!' && *nxtBeg == '=') {
      ++nxtBeg;
      ++nxtPos.col;
    }
    return {curBeg, nxtBeg};
  }
  while (nxtBeg != srcEnd && (std::isalnum(*nxtBeg) || *nxtBeg == '_')) {
    ++nxtBeg;
    ++nxtPos.col;
  }
  return {curBeg, nxtBeg};
}